

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O2

bool Fossilize::json_value<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
               (VkRenderPassCreateInfo2 *pass,MemoryPoolAllocator<rapidjson::CrtAllocator> *alloc,
               Value *out_value)

{
  VkSubpassDependency2 *pVVar1;
  void *pvVar2;
  VkAttachmentDescription2 *pVVar3;
  VkSubpassDescription2 *pVVar4;
  bool bVar5;
  uint32_t j;
  ulong uVar6;
  uint32_t i_1;
  uint32_t i;
  ulong uVar7;
  uint32_t j_1;
  long lVar8;
  SizeType SVar9;
  Value view_masks;
  Value dep;
  Value input;
  Data local_268;
  Value attachments;
  Value subpasses;
  Value deps;
  StringRefType local_210;
  StringRefType local_200;
  StringRefType local_1f0;
  StringRefType local_1e0;
  StringRefType local_1d0;
  StringRefType local_1c0;
  StringRefType local_1b0;
  StringRefType local_1a0;
  StringRefType local_190;
  StringRefType local_180;
  StringRefType local_170;
  StringRefType local_160;
  StringRefType local_150;
  StringRefType local_140;
  StringRefType local_130;
  StringRefType local_120;
  StringRefType local_110;
  StringRefType local_100;
  StringRefType local_f0;
  StringRefType local_e0;
  StringRefType local_d0;
  StringRefType local_c0;
  StringRefType local_b0;
  StringRefType local_a0;
  StringRefType local_90;
  StringRefType local_80;
  StringRefType local_70;
  StringRefType local_60;
  StringRefType local_50;
  StringRefType local_40;
  
  local_268.n.i64 = (Number)0x0;
  local_268.s.str = (Ch *)0x3000000000000;
  local_40.s = "flags";
  local_40.length = 5;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember<unsigned_int>
            ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)&local_268.s,&local_40,pass->flags,alloc);
  deps.data_.n = (Number)0x0;
  deps.data_.s.str = (Ch *)0x4000000000000;
  subpasses.data_.n = (Number)0x0;
  subpasses.data_.s.str = (Ch *)0x4000000000000;
  attachments.data_.n = (Number)0x0;
  attachments.data_.s.str = (Ch *)0x4000000000000;
  if (pass->pCorrelatedViewMasks != (uint32_t *)0x0) {
    view_masks.data_.n = (Number)0x0;
    view_masks.data_.s.str = (Ch *)0x4000000000000;
    for (uVar7 = 0; uVar7 < pass->correlatedViewMaskCount; uVar7 = uVar7 + 1) {
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::PushBack<unsigned_int>(&view_masks,pass->pCorrelatedViewMasks[uVar7],alloc);
    }
    local_50.s = "correlatedViewMasks";
    local_50.length = 0x13;
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)&local_268.s,&local_50,&view_masks,alloc);
  }
  if (pass->pDependencies != (VkSubpassDependency2 *)0x0) {
    lVar8 = 0x2c;
    for (uVar7 = 0; uVar7 < pass->dependencyCount; uVar7 = uVar7 + 1) {
      pVVar1 = pass->pDependencies;
      dep.data_.n = (Number)0x0;
      dep.data_.s.str = (Ch *)0x3000000000000;
      local_90.s = "dependencyFlags";
      local_90.length = 0xf;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember<unsigned_int>(&dep,&local_90,*(uint *)((long)pVVar1 + lVar8 + -4),alloc);
      local_a0.s = "dstAccessMask";
      local_a0.length = 0xd;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember<unsigned_int>(&dep,&local_a0,*(uint *)((long)pVVar1 + lVar8 + -8),alloc);
      local_b0.s = "srcAccessMask";
      local_b0.length = 0xd;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember<unsigned_int>(&dep,&local_b0,*(uint *)((long)pVVar1 + lVar8 + -0xc),alloc);
      local_c0.s = "dstStageMask";
      local_c0.length = 0xc;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember<unsigned_int>(&dep,&local_c0,*(uint *)((long)pVVar1 + lVar8 + -0x10),alloc);
      local_d0.s = "srcStageMask";
      local_d0.length = 0xc;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember<unsigned_int>(&dep,&local_d0,*(uint *)((long)pVVar1 + lVar8 + -0x14),alloc);
      local_e0.s = "dstSubpass";
      SVar9 = 10;
      local_e0.length = SVar9;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember<unsigned_int>(&dep,&local_e0,*(uint *)((long)pVVar1 + lVar8 + -0x18),alloc);
      local_f0.s = "srcSubpass";
      local_f0.length = SVar9;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember<unsigned_int>(&dep,&local_f0,*(uint *)((long)pVVar1 + lVar8 + -0x1c),alloc);
      local_100.s = "viewOffset";
      local_100.length = SVar9;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember<int>(&dep,&local_100,*(int *)((long)&pVVar1->sType + lVar8),alloc);
      pvVar2 = *(void **)((long)pVVar1 + lVar8 + -0x24);
      if (pvVar2 != (void *)0x0) {
        view_masks.data_.n = (Number)0x0;
        view_masks.data_.s.str = (Ch *)0x0;
        bVar5 = pnext_chain_json_value<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                          (pvVar2,alloc,&view_masks,(DynamicStateInfo *)0x0);
        if (!bVar5) {
          return false;
        }
        input.data_.n = (Number)anon_var_dwarf_11b0d;
        input.data_._8_4_ = 5;
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember(&dep,(StringRefType *)&input,&view_masks,alloc);
      }
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::PushBack(&deps,&dep,alloc);
      lVar8 = lVar8 + 0x30;
    }
    local_60.s = "dependencies";
    local_60.length = 0xc;
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)&local_268.s,&local_60,&deps,alloc);
  }
  if (pass->pAttachments != (VkAttachmentDescription2 *)0x0) {
    lVar8 = 0x30;
    for (uVar7 = 0; uVar7 < pass->attachmentCount; uVar7 = uVar7 + 1) {
      pVVar3 = pass->pAttachments;
      dep.data_.n = (Number)0x0;
      dep.data_.s.str = (Ch *)0x3000000000000;
      local_110.s = "flags";
      local_110.length = 5;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember<unsigned_int>(&dep,&local_110,*(uint *)((long)pVVar3 + lVar8 + -0x20),alloc);
      local_120.s = "format";
      local_120.length = 6;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember<VkFormat>(&dep,&local_120,*(VkFormat *)((long)pVVar3 + lVar8 + -0x1c),alloc);
      local_130.s = "finalLayout";
      local_130.length = 0xb;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember<VkImageLayout>
                (&dep,&local_130,*(VkImageLayout *)((long)&pVVar3->sType + lVar8),alloc);
      local_140.s = "initialLayout";
      local_140.length = 0xd;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember<VkImageLayout>
                (&dep,&local_140,*(VkImageLayout *)((long)pVVar3 + lVar8 + -4),alloc);
      local_150.s = "loadOp";
      local_150.length = 6;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember<VkAttachmentLoadOp>
                (&dep,&local_150,*(VkAttachmentLoadOp *)((long)pVVar3 + lVar8 + -0x14),alloc);
      local_160.s = "storeOp";
      local_160.length = 7;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember<VkAttachmentStoreOp>
                (&dep,&local_160,*(VkAttachmentStoreOp *)((long)pVVar3 + lVar8 + -0x10),alloc);
      local_170.s = "samples";
      local_170.length = 7;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember<VkSampleCountFlagBits>
                (&dep,&local_170,*(VkSampleCountFlagBits *)((long)pVVar3 + lVar8 + -0x18),alloc);
      local_180.s = "stencilLoadOp";
      local_180.length = 0xd;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember<VkAttachmentLoadOp>
                (&dep,&local_180,*(VkAttachmentLoadOp *)((long)pVVar3 + lVar8 + -0xc),alloc);
      local_190.s = "stencilStoreOp";
      local_190.length = 0xe;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember<VkAttachmentStoreOp>
                (&dep,&local_190,*(VkAttachmentStoreOp *)((long)pVVar3 + lVar8 + -8),alloc);
      pvVar2 = *(void **)((long)pVVar3 + lVar8 + -0x28);
      if (pvVar2 != (void *)0x0) {
        view_masks.data_.n = (Number)0x0;
        view_masks.data_.s.str = (Ch *)0x0;
        bVar5 = pnext_chain_json_value<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                          (pvVar2,alloc,&view_masks,(DynamicStateInfo *)0x0);
        if (!bVar5) {
          return false;
        }
        input.data_.n = (Number)anon_var_dwarf_11b0d;
        input.data_._8_4_ = 5;
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember(&dep,(StringRefType *)&input,&view_masks,alloc);
      }
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::PushBack(&attachments,&dep,alloc);
      lVar8 = lVar8 + 0x38;
    }
    local_70.s = "attachments";
    local_70.length = 0xb;
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)&local_268.s,&local_70,&attachments,alloc);
  }
  for (uVar7 = 0; uVar7 < pass->subpassCount; uVar7 = uVar7 + 1) {
    pVVar4 = pass->pSubpasses;
    dep.data_.n = (Number)0x0;
    dep.data_.s.str = (Ch *)0x3000000000000;
    local_210.s = "flags";
    local_210.length = 5;
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember<unsigned_int>(&dep,&local_210,pVVar4[uVar7].flags,alloc);
    local_1a0.s = "pipelineBindPoint";
    local_1a0.length = 0x11;
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember<VkPipelineBindPoint>(&dep,&local_1a0,pVVar4[uVar7].pipelineBindPoint,alloc);
    local_1b0.s = "viewMask";
    local_1b0.length = 8;
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember<unsigned_int>(&dep,&local_1b0,pVVar4[uVar7].viewMask,alloc);
    if (pVVar4[uVar7].pPreserveAttachments != (uint32_t *)0x0) {
      view_masks.data_.n = (Number)0x0;
      view_masks.data_.s.str = (Ch *)0x4000000000000;
      for (uVar6 = 0; uVar6 < pVVar4[uVar7].preserveAttachmentCount; uVar6 = uVar6 + 1) {
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::PushBack<unsigned_int>(&view_masks,pVVar4[uVar7].pPreserveAttachments[uVar6],alloc);
      }
      local_1c0.s = "preserveAttachments";
      local_1c0.length = 0x13;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember(&dep,&local_1c0,&view_masks,alloc);
    }
    if (pVVar4[uVar7].pInputAttachments != (VkAttachmentReference2 *)0x0) {
      view_masks.data_.n = (Number)0x0;
      view_masks.data_.s.str = (Ch *)0x4000000000000;
      lVar8 = 0;
      for (uVar6 = 0; uVar6 < pVVar4[uVar7].inputAttachmentCount; uVar6 = uVar6 + 1) {
        input.data_.n = (Number)0x0;
        input.data_.s.str = (Ch *)0x0;
        bVar5 = json_value<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                          ((VkAttachmentReference2 *)
                           ((long)&(pVVar4[uVar7].pInputAttachments)->sType + lVar8),alloc,&input);
        if (!bVar5) {
          return false;
        }
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::PushBack(&view_masks,&input,alloc);
        lVar8 = lVar8 + 0x20;
      }
      local_1d0.s = "inputAttachments";
      local_1d0.length = 0x10;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember(&dep,&local_1d0,&view_masks,alloc);
    }
    if (pVVar4[uVar7].pColorAttachments != (VkAttachmentReference2 *)0x0) {
      view_masks.data_.n = (Number)0x0;
      view_masks.data_.s.str = (Ch *)0x4000000000000;
      lVar8 = 0;
      for (uVar6 = 0; uVar6 < pVVar4[uVar7].colorAttachmentCount; uVar6 = uVar6 + 1) {
        input.data_.n = (Number)0x0;
        input.data_.s.str = (Ch *)0x0;
        bVar5 = json_value<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                          ((VkAttachmentReference2 *)
                           ((long)&(pVVar4[uVar7].pColorAttachments)->sType + lVar8),alloc,&input);
        if (!bVar5) {
          return false;
        }
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::PushBack(&view_masks,&input,alloc);
        lVar8 = lVar8 + 0x20;
      }
      local_1e0.s = "colorAttachments";
      local_1e0.length = 0x10;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember(&dep,&local_1e0,&view_masks,alloc);
    }
    if (pVVar4[uVar7].pResolveAttachments != (VkAttachmentReference2 *)0x0) {
      view_masks.data_.n = (Number)0x0;
      view_masks.data_.s.str = (Ch *)0x4000000000000;
      lVar8 = 0;
      for (uVar6 = 0; uVar6 < pVVar4[uVar7].colorAttachmentCount; uVar6 = uVar6 + 1) {
        input.data_.n = (Number)0x0;
        input.data_.s.str = (Ch *)0x0;
        bVar5 = json_value<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                          ((VkAttachmentReference2 *)
                           ((long)&(pVVar4[uVar7].pResolveAttachments)->sType + lVar8),alloc,&input)
        ;
        if (!bVar5) {
          return false;
        }
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::PushBack(&view_masks,&input,alloc);
        lVar8 = lVar8 + 0x20;
      }
      local_1f0.s = "resolveAttachments";
      local_1f0.length = 0x12;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember(&dep,&local_1f0,&view_masks,alloc);
    }
    if (pVVar4[uVar7].pDepthStencilAttachment != (VkAttachmentReference2 *)0x0) {
      view_masks.data_.n = (Number)0x0;
      view_masks.data_.s.str = (Ch *)0x0;
      bVar5 = json_value<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                        (pVVar4[uVar7].pDepthStencilAttachment,alloc,&view_masks);
      if (!bVar5) {
        return false;
      }
      local_200.s = "depthStencilAttachment";
      local_200.length = 0x16;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember(&dep,&local_200,&view_masks,alloc);
    }
    if (pVVar4[uVar7].pNext != (void *)0x0) {
      view_masks.data_.n = (Number)0x0;
      view_masks.data_.s.str = (Ch *)0x0;
      bVar5 = pnext_chain_json_value<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                        (pVVar4[uVar7].pNext,alloc,&view_masks,(DynamicStateInfo *)0x0);
      if (!bVar5) {
        return false;
      }
      input.data_.n = (Number)anon_var_dwarf_11b0d;
      input.data_._8_4_ = 5;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember(&dep,(StringRefType *)&input,&view_masks,alloc);
    }
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    PushBack(&subpasses,&dep,alloc);
  }
  local_80.s = "subpasses";
  local_80.length = 9;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&local_268.s,&local_80,&subpasses,alloc);
  if (pass->pNext != (void *)0x0) {
    view_masks.data_.n = (Number)0x0;
    view_masks.data_.s.str = (Ch *)0x0;
    bVar5 = pnext_chain_json_value<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                      (pass->pNext,alloc,&view_masks,(DynamicStateInfo *)0x0);
    if (!bVar5) {
      return false;
    }
    input.data_.n = (Number)anon_var_dwarf_11b0d;
    input.data_._8_4_ = 5;
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)&local_268.s,(StringRefType *)&input,&view_masks,alloc);
  }
  if (&local_268 != &out_value->data_) {
    (out_value->data_).n = local_268.n;
    (out_value->data_).s.str = local_268.s.str;
  }
  return true;
}

Assistant:

static bool json_value(const VkRenderPassCreateInfo2 &pass, Allocator &alloc, Value *out_value)
{
	Value json_object(kObjectType);
	json_object.AddMember("flags", pass.flags, alloc);

	Value deps(kArrayType);
	Value subpasses(kArrayType);
	Value attachments(kArrayType);

	if (pass.pCorrelatedViewMasks)
	{
		Value view_masks(kArrayType);
		for (uint32_t i = 0; i < pass.correlatedViewMaskCount; i++)
			view_masks.PushBack(pass.pCorrelatedViewMasks[i], alloc);
		json_object.AddMember("correlatedViewMasks", view_masks, alloc);
	}

	if (pass.pDependencies)
	{
		for (uint32_t i = 0; i < pass.dependencyCount; i++)
		{
			auto &d = pass.pDependencies[i];
			Value dep(kObjectType);
			dep.AddMember("dependencyFlags", d.dependencyFlags, alloc);
			dep.AddMember("dstAccessMask", d.dstAccessMask, alloc);
			dep.AddMember("srcAccessMask", d.srcAccessMask, alloc);
			dep.AddMember("dstStageMask", d.dstStageMask, alloc);
			dep.AddMember("srcStageMask", d.srcStageMask, alloc);
			dep.AddMember("dstSubpass", d.dstSubpass, alloc);
			dep.AddMember("srcSubpass", d.srcSubpass, alloc);
			dep.AddMember("viewOffset", d.viewOffset, alloc);
			if (!pnext_chain_add_json_value(dep, d, alloc, nullptr))
				return false;
			deps.PushBack(dep, alloc);
		}
		json_object.AddMember("dependencies", deps, alloc);
	}

	if (pass.pAttachments)
	{
		for (uint32_t i = 0; i < pass.attachmentCount; i++)
		{
			auto &a = pass.pAttachments[i];
			Value att(kObjectType);

			att.AddMember("flags", a.flags, alloc);
			att.AddMember("format", a.format, alloc);
			att.AddMember("finalLayout", a.finalLayout, alloc);
			att.AddMember("initialLayout", a.initialLayout, alloc);
			att.AddMember("loadOp", a.loadOp, alloc);
			att.AddMember("storeOp", a.storeOp, alloc);
			att.AddMember("samples", a.samples, alloc);
			att.AddMember("stencilLoadOp", a.stencilLoadOp, alloc);
			att.AddMember("stencilStoreOp", a.stencilStoreOp, alloc);
			if (!pnext_chain_add_json_value(att, a, alloc, nullptr))
				return false;
			attachments.PushBack(att, alloc);
		}
		json_object.AddMember("attachments", attachments, alloc);
	}

	for (uint32_t i = 0; i < pass.subpassCount; i++)
	{
		auto &sub = pass.pSubpasses[i];
		Value p(kObjectType);
		p.AddMember("flags", sub.flags, alloc);
		p.AddMember("pipelineBindPoint", sub.pipelineBindPoint, alloc);
		p.AddMember("viewMask", sub.viewMask, alloc);

		if (sub.pPreserveAttachments)
		{
			Value preserves(kArrayType);
			for (uint32_t j = 0; j < sub.preserveAttachmentCount; j++)
				preserves.PushBack(sub.pPreserveAttachments[j], alloc);
			p.AddMember("preserveAttachments", preserves, alloc);
		}

		if (sub.pInputAttachments)
		{
			Value inputs(kArrayType);
			for (uint32_t j = 0; j < sub.inputAttachmentCount; j++)
			{
				Value input;
				if (!json_value(sub.pInputAttachments[j], alloc, &input))
					return false;
				inputs.PushBack(input, alloc);
			}
			p.AddMember("inputAttachments", inputs, alloc);
		}

		if (sub.pColorAttachments)
		{
			Value colors(kArrayType);
			for (uint32_t j = 0; j < sub.colorAttachmentCount; j++)
			{
				Value color;
				if (!json_value(sub.pColorAttachments[j], alloc, &color))
					return false;
				colors.PushBack(color, alloc);
			}
			p.AddMember("colorAttachments", colors, alloc);
		}

		if (sub.pResolveAttachments)
		{
			Value resolves(kArrayType);
			for (uint32_t j = 0; j < sub.colorAttachmentCount; j++)
			{
				Value resolve;
				if (!json_value(sub.pResolveAttachments[j], alloc, &resolve))
					return false;
				resolves.PushBack(resolve, alloc);
			}
			p.AddMember("resolveAttachments", resolves, alloc);
		}

		if (sub.pDepthStencilAttachment)
		{
			Value depth_stencil;
			if (!json_value(*sub.pDepthStencilAttachment, alloc, &depth_stencil))
				return false;
			p.AddMember("depthStencilAttachment", depth_stencil, alloc);
		}

		if (!pnext_chain_add_json_value(p, sub, alloc, nullptr))
			return false;
		subpasses.PushBack(p, alloc);
	}
	json_object.AddMember("subpasses", subpasses, alloc);

	if (!pnext_chain_add_json_value(json_object, pass, alloc, nullptr))
		return false;

	*out_value = json_object;
	return true;
}